

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_IsValidPointGrid(int dim,bool is_rat,int point_count0,int point_count1,int point_stride0,
                        int point_stride1,double *p)

{
  int point_stride1_local;
  int point_stride0_local;
  int point_count1_local;
  int point_count0_local;
  bool is_rat_local;
  int dim_local;
  
  if ((((dim < 1) || (point_count0 < 1)) || (point_count1 < 1)) || (p == (double *)0x0)) {
    is_rat_local = false;
  }
  else {
    point_count0_local = dim;
    if (is_rat) {
      point_count0_local = dim + 1;
    }
    if ((point_stride0 < point_count0_local) || (point_stride1 < point_count0_local)) {
      is_rat_local = false;
    }
    else {
      if (point_stride1 < point_stride0) {
        if (point_stride0 < point_stride1 * point_count1) {
          return false;
        }
      }
      else if (point_stride1 < point_stride0 * point_count0) {
        return false;
      }
      is_rat_local = true;
    }
  }
  return is_rat_local;
}

Assistant:

bool 
ON_IsValidPointGrid(
        int dim,
        bool is_rat,
        int point_count0, int point_count1,
        int point_stride0, int point_stride1,
        const double* p
        )
{
  if ( dim < 1 || point_count0 < 1 || point_count1 < 1 || p == nullptr )
    return false;
  if ( is_rat )
    dim++;
  if ( point_stride0 < dim || point_stride1 < dim )
    return false;
  if ( point_stride0 <= point_stride1 ) {
    if ( point_stride1 < point_stride0*point_count0 )
      return false;
  }
  else {
    if ( point_stride0 < point_stride1*point_count1 )
      return false;
  }
  return true;
}